

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_zip64.c
# Opt level: O0

void verify_zip_filesize(uint64_t size,int expected)

{
  archive_entry *v2;
  archive_entry *entry;
  long v1;
  int in_ESI;
  int64_t in_RDI;
  size_t used;
  char buff [256];
  archive_entry *ae;
  archive *a;
  void *in_stack_fffffffffffffeb8;
  archive_entry *paVar1;
  archive_entry *in_stack_fffffffffffffec0;
  archive *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  wchar_t in_stack_fffffffffffffed4;
  archive *in_stack_fffffffffffffed8;
  void *in_stack_fffffffffffffef0;
  
  v2 = (archive_entry *)archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (wchar_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8);
  archive_write_set_format_zip(in_stack_fffffffffffffec8);
  paVar1 = v2;
  assertion_equal_int((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                      (longlong)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                      (longlong)v2,(char *)0x22079b,in_stack_fffffffffffffef0);
  archive_write_set_format_option
            ((archive *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (char *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,(char *)paVar1);
  assertion_equal_int((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                      (longlong)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                      (longlong)v2,(char *)0x2207ec,in_stack_fffffffffffffef0);
  archive_write_open_memory
            (in_stack_fffffffffffffed8,
             (void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (size_t)in_stack_fffffffffffffec8,(size_t *)in_stack_fffffffffffffec0);
  paVar1 = v2;
  assertion_equal_int((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                      (longlong)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                      (longlong)v2,(char *)0x22083a,in_stack_fffffffffffffef0);
  entry = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (wchar_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (wchar_t)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,paVar1);
  archive_entry_set_pathname(in_stack_fffffffffffffec0,(char *)paVar1);
  archive_entry_set_mode(entry,0x81a4);
  archive_entry_set_size(entry,in_RDI);
  v1 = (long)in_ESI;
  archive_write_header((archive *)in_stack_fffffffffffffec0,paVar1);
  assertion_equal_int((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,v1,
                      (char *)in_stack_fffffffffffffec0,0,(char *)0x2208fe,in_stack_fffffffffffffef0
                     );
  archive_write_free((archive *)0x22090b);
  assertion_equal_int((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,v1,
                      (char *)in_stack_fffffffffffffec0,(longlong)v2,(char *)0x22093d,
                      in_stack_fffffffffffffef0);
  return;
}

Assistant:

static void
verify_zip_filesize(uint64_t size, int expected)
{
	struct archive *a;
	struct archive_entry *ae;
	char buff[256];
	size_t used;

	/* Zip format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	/* Disable Zip64 extensions. */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_format_option(a, "zip", "zip64", NULL));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_pathname(ae, "test");
	archive_entry_set_mode(ae, AE_IFREG | 0644);
	archive_entry_set_size(ae, size);
	assertEqualInt(expected, archive_write_header(a, ae));

	/* Don't actually write 4GB! ;-) */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));
}